

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall Token::removeBrace(Token *this,char open,char close)

{
  size_t sVar1;
  size_t end;
  size_t start;
  char close_local;
  char open_local;
  Token *this_local;
  
  end = std::__cxx11::string::find((char)this,(ulong)(uint)(int)open);
  while ((end != 0xffffffffffffffff &&
         (sVar1 = braceEnd(&this->content,end,open,close), sVar1 != 0xffffffffffffffff))) {
    std::__cxx11::string::erase((ulong)this,end);
    end = std::__cxx11::string::find((char)this,(ulong)(uint)(int)open);
  }
  return;
}

Assistant:

void removeBrace(char open, char close) {
        size_t start = content.find(open);
        while (start != std::string::npos) {
            const size_t end = braceEnd(content, start, open, close);
            if (end == std::string::npos) {
                return;
            }

            content.erase(start, end - start + 1);

            start = content.find(open);
        }
    }